

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001b2900 = 0x2e2e2e2e2e2e2e;
    uRam00000000001b2907 = 0x2e2e2e2e2e2e2e2e;
    _DAT_001b28f0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001b28f8 = 0x2e2e2e2e2e2e2e;
    DAT_001b28ff = 0x2e;
    _DAT_001b28e0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001b28e8 = 0x2e2e2e2e2e2e2e2e;
    _DAT_001b28d0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001b28d8 = 0x2e2e2e2e2e2e2e2e;
    _line = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001b28c8 = 0x2e2e2e2e2e2e2e2e;
    DAT_001b290f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }